

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileLibraryTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmMakefileLibraryTargetGenerator::WriteModuleLibraryRules
          (cmMakefileLibraryTargetGenerator *this,bool relink)

{
  string *__return_storage_ptr__;
  cmGeneratorTarget *pcVar1;
  cmLocalUnixMakefileGenerator3 *pcVar2;
  bool bVar3;
  pointer linkLineComputer_00;
  string local_1a0;
  cmStateSnapshot local_180;
  cmStateDirectory local_168;
  undefined1 local_140 [8];
  unique_ptr<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_> linkLineComputer;
  allocator<char> local_111;
  string local_110;
  undefined1 local_f0 [8];
  string extraFlags;
  string linkRuleVar;
  undefined1 local_90 [8];
  string linkLanguage;
  string local_68;
  string local_38;
  undefined1 local_12;
  byte local_11;
  undefined1 auStack_10 [6];
  bool requiresDeviceLinking;
  bool relink_local;
  cmMakefileLibraryTargetGenerator *this_local;
  
  local_11 = relink;
  _auStack_10 = this;
  if (!relink) {
    pcVar1 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
    pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
    cmMakefileTargetGenerator::GetConfigName_abi_cxx11_
              (&local_38,&this->super_cmMakefileTargetGenerator);
    bVar3 = requireDeviceLinking(pcVar1,(cmLocalGenerator *)pcVar2,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    local_12 = bVar3;
    if (bVar3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_68,"CMAKE_CUDA_DEVICE_LINK_LIBRARY",
                 (allocator<char> *)(linkLanguage.field_2._M_local_buf + 0xf));
      WriteDeviceLibraryRules(this,&local_68,(bool)(local_11 & 1));
      std::__cxx11::string::~string((string *)&local_68);
      std::allocator<char>::~allocator((allocator<char> *)(linkLanguage.field_2._M_local_buf + 0xf))
      ;
    }
  }
  pcVar1 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  __return_storage_ptr__ = (string *)((long)&linkRuleVar.field_2 + 8);
  cmMakefileTargetGenerator::GetConfigName_abi_cxx11_
            (__return_storage_ptr__,&this->super_cmMakefileTargetGenerator);
  cmGeneratorTarget::GetLinkerLanguage((string *)local_90,pcVar1,__return_storage_ptr__);
  std::__cxx11::string::~string((string *)(linkRuleVar.field_2._M_local_buf + 8));
  cmStrCat<char_const(&)[7],std::__cxx11::string&,char_const(&)[22]>
            ((string *)((long)&extraFlags.field_2 + 8),(char (*) [7])0x104930a,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
             (char (*) [22])"_CREATE_SHARED_MODULE");
  std::__cxx11::string::string((string *)local_f0);
  cmMakefileTargetGenerator::GetTargetLinkFlags
            (&this->super_cmMakefileTargetGenerator,(string *)local_f0,(string *)local_90);
  pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"CMAKE_MODULE_LINKER_FLAGS",&local_111);
  cmMakefileTargetGenerator::GetConfigName_abi_cxx11_
            ((string *)&linkLineComputer,&this->super_cmMakefileTargetGenerator);
  cmLocalGenerator::AddConfigVariableFlags
            ((cmLocalGenerator *)pcVar2,(string *)local_f0,&local_110,(string *)&linkLineComputer);
  std::__cxx11::string::~string((string *)&linkLineComputer);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  cmLocalGenerator::GetStateSnapshot(&local_180,(cmLocalGenerator *)pcVar2);
  cmStateSnapshot::GetDirectory(&local_168,&local_180);
  cmMakefileTargetGenerator::CreateLinkLineComputer
            ((cmMakefileTargetGenerator *)local_140,(cmOutputConverter *)this,
             (cmStateDirectory *)pcVar2);
  pcVar1 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  linkLineComputer_00 =
       std::unique_ptr<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_>::get
                 ((unique_ptr<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_> *)
                  local_140);
  cmMakefileTargetGenerator::GetConfigName_abi_cxx11_
            (&local_1a0,&this->super_cmMakefileTargetGenerator);
  cmLocalGenerator::AppendModuleDefinitionFlag
            ((cmLocalGenerator *)pcVar2,(string *)local_f0,pcVar1,linkLineComputer_00,&local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  bVar3 = cmLocalGenerator::AppendLWYUFlags
                    ((cmLocalGenerator *)(this->super_cmMakefileTargetGenerator).LocalGenerator,
                     (string *)local_f0,
                     (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                     GeneratorTarget,(string *)local_90);
  (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.UseLWYU = bVar3;
  WriteLibraryRules(this,(string *)((long)&extraFlags.field_2 + 8),(string *)local_f0,
                    (bool)(local_11 & 1));
  std::unique_ptr<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_>::~unique_ptr
            ((unique_ptr<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_> *)local_140);
  std::__cxx11::string::~string((string *)local_f0);
  std::__cxx11::string::~string((string *)(extraFlags.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_90);
  return;
}

Assistant:

void cmMakefileLibraryTargetGenerator::WriteModuleLibraryRules(bool relink)
{
  if (!relink) {
    const bool requiresDeviceLinking = requireDeviceLinking(
      *this->GeneratorTarget, *this->LocalGenerator, this->GetConfigName());
    if (requiresDeviceLinking) {
      this->WriteDeviceLibraryRules("CMAKE_CUDA_DEVICE_LINK_LIBRARY", relink);
    }
  }

  std::string linkLanguage =
    this->GeneratorTarget->GetLinkerLanguage(this->GetConfigName());
  std::string linkRuleVar =
    cmStrCat("CMAKE_", linkLanguage, "_CREATE_SHARED_MODULE");

  std::string extraFlags;
  this->GetTargetLinkFlags(extraFlags, linkLanguage);
  this->LocalGenerator->AddConfigVariableFlags(
    extraFlags, "CMAKE_MODULE_LINKER_FLAGS", this->GetConfigName());

  std::unique_ptr<cmLinkLineComputer> linkLineComputer =
    this->CreateLinkLineComputer(
      this->LocalGenerator,
      this->LocalGenerator->GetStateSnapshot().GetDirectory());

  this->LocalGenerator->AppendModuleDefinitionFlag(
    extraFlags, this->GeneratorTarget, linkLineComputer.get(),
    this->GetConfigName());

  this->UseLWYU = this->LocalGenerator->AppendLWYUFlags(
    extraFlags, this->GeneratorTarget, linkLanguage);

  this->WriteLibraryRules(linkRuleVar, extraFlags, relink);
}